

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Outlining.cpp
# Opt level: O1

void __thiscall wasm::Outlining::outline(Outlining *this,Module *module,Sequences *seqByFunc)

{
  pointer pOVar1;
  pointer pOVar2;
  long lVar3;
  Name name;
  Name name_00;
  pointer wasm;
  mapped_type *pmVar4;
  ulong uVar5;
  Function *pFVar6;
  undefined1 auVar7 [8];
  undefined1 local_308 [8];
  ReconstructStringifyWalker reconstruct;
  undefined1 local_68 [8];
  vector<wasm::Name,_std::allocator<wasm::Name>_> keys;
  undefined1 auStack_48 [8];
  Name func;
  
  keys.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)module;
  std::vector<wasm::Name,_std::allocator<wasm::Name>_>::vector
            ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)local_68,
             (seqByFunc->_M_h)._M_element_count,(allocator_type *)local_308);
  std::
  transform<std::__detail::_Node_iterator<std::pair<wasm::Name_const,std::vector<wasm::OutliningSequence,std::allocator<wasm::OutliningSequence>>>,false,true>,__gnu_cxx::__normal_iterator<wasm::Name*,std::vector<wasm::Name,std::allocator<wasm::Name>>>,wasm::Outlining::outline(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::OutliningSequence,std::allocator<wasm::OutliningSequence>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::OutliningSequence,std::allocator<wasm::OutliningSequence>>>>>)::_lambda(auto:1)_1_>
            ((seqByFunc->_M_h)._M_before_begin._M_nxt,0,local_68);
  reconstruct.func =
       (Function *)
       keys.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
       super__Vector_impl_data._M_start;
  if (local_68 !=
      (undefined1  [8])
      keys.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
      super__Vector_impl_data._M_start) {
    auVar7 = local_68;
    do {
      auStack_48 = (undefined1  [8])(((pointer)auVar7)->super_IString).str._M_len;
      func.super_IString.str._M_len = (size_t)(((pointer)auVar7)->super_IString).str._M_str;
      pmVar4 = std::__detail::
               _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)seqByFunc,(key_type *)auStack_48);
      pOVar1 = (pmVar4->
               super__Vector_base<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pmVar4 = std::__detail::
               _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)seqByFunc,(key_type *)auStack_48);
      pOVar2 = (pmVar4->
               super__Vector_base<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (pOVar1 != pOVar2) {
        uVar5 = (long)pOVar2 - (long)pOVar1 >> 5;
        lVar3 = 0x3f;
        if (uVar5 != 0) {
          for (; uVar5 >> lVar3 == 0; lVar3 = lVar3 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<wasm::OutliningSequence*,std::vector<wasm::OutliningSequence,std::allocator<wasm::OutliningSequence>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<wasm::Outlining::outline(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::OutliningSequence,std::allocator<wasm::OutliningSequence>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::OutliningSequence,std::allocator<wasm::OutliningSequence>>>>>)::_lambda(wasm::OutliningSequence,wasm::OutliningSequence)_1_>>
                  (pOVar1,pOVar2,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<wasm::OutliningSequence*,std::vector<wasm::OutliningSequence,std::allocator<wasm::OutliningSequence>>>,__gnu_cxx::__ops::_Iter_comp_iter<wasm::Outlining::outline(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::OutliningSequence,std::allocator<wasm::OutliningSequence>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::OutliningSequence,std::allocator<wasm::OutliningSequence>>>>>)::_lambda(wasm::OutliningSequence,wasm::OutliningSequence)_1_>>
                  (pOVar1,pOVar2);
      }
      wasm = keys.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
      name.super_IString.str._M_str = (char *)func.super_IString.str._M_len;
      name.super_IString.str._M_len = (size_t)auStack_48;
      pFVar6 = Module::getFunction((Module *)
                                   keys.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage,name);
      ReconstructStringifyWalker::ReconstructStringifyWalker
                ((ReconstructStringifyWalker *)local_308,(Module *)wasm,pFVar6);
      pmVar4 = std::__detail::
               _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)seqByFunc,(key_type *)auStack_48);
      std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>::_M_move_assign
                ((vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_> *)
                 &reconstruct.state,pmVar4);
      name_00.super_IString.str._M_str = (char *)func.super_IString.str._M_len;
      name_00.super_IString.str._M_len = (size_t)auStack_48;
      pFVar6 = Module::getFunction((Module *)
                                   keys.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage,name_00);
      ReconstructStringifyWalker::startExistingFunction
                ((ReconstructStringifyWalker *)local_308,pFVar6);
      Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
      ::walk((Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
              *)local_308,&pFVar6->body);
      ReconstructStringifyWalker::addUniqueSymbol
                ((ReconstructStringifyWalker *)local_308,(SeparatorReason)_local_308);
      while (reconstruct.super_StringifyWalker<wasm::ReconstructStringifyWalker>.controlFlowQueue.c.
             super__Deque_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
             super__Deque_impl_data._M_start._M_node !=
             (_Map_pointer)
             reconstruct.super_StringifyWalker<wasm::ReconstructStringifyWalker>.controlFlowQueue.c.
             super__Deque_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
             super__Deque_impl_data._M_map_size) {
        StringifyWalker<wasm::ReconstructStringifyWalker>::dequeueControlFlow
                  ((StringifyWalker<wasm::ReconstructStringifyWalker> *)local_308);
      }
      std::
      _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)&reconstruct.outlinedBuilder.scopeStack.
                        super__Vector_base<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_>::~vector
                ((vector<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_> *)
                 ((long)&reconstruct.outlinedBuilder.debugLoc.
                         super__Variant_base<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
                         .
                         super__Move_assign_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
                         .
                         super__Copy_assign_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
                         .
                         super__Move_ctor_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
                 + 0x10));
      std::
      _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)&reconstruct.existingBuilder.scopeStack.
                        super__Vector_base<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_>::~vector
                ((vector<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_> *)
                 ((long)&reconstruct.existingBuilder.debugLoc.
                         super__Variant_base<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
                         .
                         super__Move_assign_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
                         .
                         super__Copy_assign_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
                         .
                         super__Move_ctor_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
                 + 0x10));
      if (reconstruct._296_8_ != 0) {
        operator_delete((void *)reconstruct._296_8_,
                        (long)reconstruct.sequences.
                              super__Vector_base<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>
                              ._M_impl.super__Vector_impl_data._M_finish - reconstruct._296_8_);
      }
      std::_Deque_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Deque_base
                ((_Deque_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 &reconstruct.super_StringifyWalker<wasm::ReconstructStringifyWalker>.
                  super_PostWalker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
                  .
                  super_Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
                  .currModule);
      if (reconstruct.super_StringifyWalker<wasm::ReconstructStringifyWalker>.
          super_PostWalker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
          .
          super_Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
          .stack.fixed._M_elems[9].currp != (Expression **)0x0) {
        operator_delete(reconstruct.super_StringifyWalker<wasm::ReconstructStringifyWalker>.
                        super_PostWalker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
                        .
                        super_Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
                        .stack.fixed._M_elems[9].currp,
                        (long)reconstruct.super_StringifyWalker<wasm::ReconstructStringifyWalker>.
                              super_PostWalker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
                              .
                              super_Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
                              .stack.flexible.
                              super__Vector_base<wasm::Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>::Task,_std::allocator<wasm::Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>::Task>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)reconstruct.super_StringifyWalker<wasm::ReconstructStringifyWalker>.
                              super_PostWalker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
                              .
                              super_Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
                              .stack.fixed._M_elems[9].currp);
      }
      auVar7 = (undefined1  [8])((long)auVar7 + 0x10);
    } while (auVar7 != (undefined1  [8])reconstruct.func);
  }
  if (local_68 != (undefined1  [8])0x0) {
    operator_delete((void *)local_68,
                    (long)keys.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)local_68);
  }
  return;
}

Assistant:

void outline(Module* module,
               Sequences seqByFunc
#if OUTLINING_DEBUG
               ,
               const HashStringifyWalker& stringify
#endif
  ) {
    // TODO: Make this a function-parallel sub-pass.
    std::vector<Name> keys(seqByFunc.size());
    std::transform(seqByFunc.begin(),
                   seqByFunc.end(),
                   keys.begin(),
                   [](auto pair) { return pair.first; });
    for (auto func : keys) {
      // During function reconstruction, a walker iterates thru each instruction
      // of a function, incrementing a counter to find matching sequences. As a
      // result, the sequences of a function must be sorted by
      // smallest start index, otherwise reconstruction will miss outlining a
      // repeat sequence.
      std::sort(seqByFunc[func].begin(),
                seqByFunc[func].end(),
                [](OutliningSequence a, OutliningSequence b) {
                  return a.startIdx < b.startIdx;
                });
      ReconstructStringifyWalker reconstruct(module, module->getFunction(func));
      reconstruct.sequences = std::move(seqByFunc[func]);
      ODBG(printReconstruct(module,
                            stringify.hashString,
                            stringify.exprs,
                            func,
                            reconstruct.sequences));
      reconstruct.doWalkFunction(module->getFunction(func));
    }
  }